

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator.cpp
# Opt level: O1

void __thiscall
helics::Translator::setOperator(Translator *this,shared_ptr<helics::TranslatorOperator> *operation)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  shared_ptr<helics::TranslatorOperations> local_38;
  shared_ptr<helics::TranslatorOperations> local_20;
  
  if ((operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    setTranslatorOperations(this,&local_38);
    this_00._M_pi =
         local_38.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  else {
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)->_M_use_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)->_M_weak_count = 1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_004cd0b8;
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    peVar1 = (operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
    p_Var2 = (operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)
             ._M_refcount._M_pi;
    (operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (operation->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)[1]._vptr__Sp_counted_base =
         (_func_int **)&PTR__CustomTranslatorOperation_004cd108;
    *(element_type **)
     &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi)[1]._M_use_count = peVar1;
    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
    local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi)[2]._vptr__Sp_counted_base = (_func_int **)p_Var2;
    setTranslatorOperations(this,&local_20);
    this_00._M_pi =
         local_20.super___shared_ptr<helics::TranslatorOperations,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_pi);
    return;
  }
  return;
}

Assistant:

void Translator::setOperator(std::shared_ptr<TranslatorOperator> operation)
{
    if (operation) {
        setTranslatorOperations(std::make_shared<CustomTranslatorOperation>(std::move(operation)));
    } else {
        setTranslatorOperations(nullptr);
    }
}